

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_util_tracek(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  uint uVar3;
  int iVar4;
  IRIns *ir;
  long lVar5;
  
  uVar3 = lj_lib_checkint(L,1);
  if ((uVar3 == 0) || (uVar1 = (L->glref).ptr64, *(uint *)(uVar1 + 0x46c) <= uVar3)) {
    lVar5 = 0;
  }
  else {
    lVar5 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar3 * 8);
  }
  uVar3 = lj_lib_checkint(L,2);
  iVar4 = 0;
  if (((lVar5 != 0) && (iVar4 = 0, 0xffff7fff < uVar3)) &&
     (*(uint *)(lVar5 + 0x28) <= uVar3 + 0x8000)) {
    ir = (IRIns *)(*(long *)(lVar5 + 0x20) + (ulong)(uVar3 + 0x8000) * 8);
    uVar3 = 0xffffffff;
    if ((ir->field_1).o == '\x1e') {
      uVar3 = (uint)(ir->field_0).op2;
      ir = (IRIns *)(*(long *)(lVar5 + 0x20) + (ulong)(ir->field_0).op1 * 8);
    }
    if (((ir->field_1).o == '\x1d') && (*(long *)((L->glref).ptr64 + 0x180) == 0)) {
      pTVar2 = L->top;
      uVar1 = (L->stack).ptr64;
      luaopen_ffi(L);
      L->top = (TValue *)((long)pTVar2 + ((L->stack).ptr64 - uVar1));
    }
    lj_ir_kvalue(L,L->top + -2,ir);
    L->top[-1].n = (double)((ir->field_1).t.irt & 0x1f);
    if (uVar3 == 0xffffffff) {
      iVar4 = 2;
    }
    else {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)(int)uVar3;
      iVar4 = 3;
    }
  }
  return iVar4;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
#if LJ_HASFFI
    if (ir->o == IR_KINT64) ctype_loadffi(L);
#endif
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}